

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O2

int __thiscall Hes_Emu::cpu_read_(Hes_Emu *this,hes_addr_t addr)

{
  state_t *psVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int present;
  
  uVar4 = addr & 0x1fff;
  uVar3 = 0;
  if (1 < uVar4 - 2) {
    psVar1 = (this->super_Hes_Cpu).state;
    present = psVar1->base + psVar1->time;
    if (uVar4 - 0xc00 < 2) {
      run_until(this,present);
      uVar3 = ((this->timer).count - 1U) / (uint)this->timer_base;
    }
    else if (uVar4 == 0x1403) {
      bVar2 = (this->irq).timer <= present;
      uVar3 = (uint)bVar2 * 4 + 2;
      if (present < (this->irq).vdp) {
        uVar3 = (uint)bVar2 * 4;
      }
    }
    else if (uVar4 == 0x1402) {
      uVar3 = (uint)(this->irq).disables;
    }
    else if (uVar4 == 0) {
      if ((this->irq).vdp <= present) {
        (this->irq).vdp = 0x40000000;
        run_until(this,present);
        irq_changed(this);
        uVar3 = 0x20;
      }
    }
    else {
      uVar3 = 0xff;
    }
  }
  return uVar3;
}

Assistant:

int Hes_Emu::cpu_read_( hes_addr_t addr )
{
	hes_time_t time = this->time();
	addr &= page_size - 1;
	switch ( addr )
	{
	case 0x0000:
		if ( irq.vdp > time )
			return 0;
		irq.vdp = future_hes_time;
		run_until( time );
		irq_changed();
		return 0x20;
		
	case 0x0002:
	case 0x0003:
		debug_printf( "VDP read not supported: %d\n", addr );
		return 0;
	
	case 0x0C01:
		//return timer.enabled; // TODO: remove?
	case 0x0C00:
		run_until( time );
		debug_printf( "Timer count read\n" );
		return (unsigned) (timer.count - 1) / timer_base;
	
	case 0x1402:
		return irq.disables;
	
	case 0x1403:
		{
			int status = 0;
			if ( irq.timer <= time ) status |= timer_mask;
			if ( irq.vdp   <= time ) status |= vdp_mask;
			return status;
		}
		
	#ifndef NDEBUG
		case 0x1000: // I/O port
		case 0x180C: // CD-ROM
		case 0x180D:
			break;
		
		default:
			debug_printf( "unmapped read  $%04X\n", addr );
	#endif
	}
	
	return unmapped;
}